

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall
QObjectPrivate::setThreadData_helper
          (QObjectPrivate *this,QThreadData *currentData,QThreadData *targetData,
          QBindingStatus *status)

{
  QObject *pQVar1;
  __pointer_type pCVar2;
  __base_type this_00;
  int i_1;
  long lVar3;
  Connection *pCVar4;
  QPostEvent *pQVar5;
  long lVar6;
  qsizetype i;
  ulong uVar7;
  
  if (status != (QBindingStatus *)0x0) {
    (this->super_QObjectData).bindingStorage.bindingStatus = status;
  }
  pQVar1 = (this->super_QObjectData).q_ptr;
  lVar6 = 0;
  lVar3 = 0;
  for (uVar7 = 0; uVar7 < (ulong)(currentData->postEventList).super_QList<QPostEvent>.d.size;
      uVar7 = uVar7 + 1) {
    pQVar5 = (currentData->postEventList).super_QList<QPostEvent>.d.ptr;
    if ((*(long *)((long)&pQVar5->event + lVar6) != 0) &&
       (*(QObject **)((long)&pQVar5->receiver + lVar6) == pQVar1)) {
      pQVar5 = (QPostEvent *)((long)&pQVar5->receiver + lVar6);
      QPostEventList::addEvent(&targetData->postEventList,pQVar5);
      pQVar5->event = (QEvent *)0x0;
      lVar3 = lVar3 + 1;
    }
    lVar6 = lVar6 + 0x18;
  }
  if ((0 < lVar3) &&
     ((targetData->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value.
      _M_b._M_p != (__pointer_type)0x0)) {
    targetData->canWait = false;
    (*(((targetData->eventDispatcher).super_QBasicAtomicPointer<QAbstractEventDispatcher>._q_value.
        _M_b._M_p)->super_QObject)._vptr_QObject[0x14])();
  }
  pCVar2 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
  if (pCVar2 != (__pointer_type)0x0) {
    if (pCVar2->currentSender != (Sender *)0x0) {
      Sender::receiverDeleted(pCVar2->currentSender);
      pCVar2->currentSender = (Sender *)0x0;
    }
    pCVar4 = (Connection *)&pCVar2->senders;
    while (pCVar4 = *(Connection **)&pCVar4->super_ConnectionOrSignalVector,
          pCVar4 != (Connection *)0x0) {
      if ((pCVar4->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p !=
          (__pointer_type)0x0) {
        LOCK();
        (targetData->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (targetData->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        this_00._M_p = (pCVar4->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value.
                       _M_b._M_p;
        if (this_00._M_p != (QThreadData *)0x0) {
          QThreadData::deref(this_00._M_p);
        }
        (pCVar4->receiverThreadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p =
             targetData;
      }
    }
  }
  LOCK();
  (targetData->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (targetData->_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  QThreadData::deref((this->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p);
  (this->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p = targetData;
  for (uVar7 = 0; uVar7 < (ulong)(this->super_QObjectData).children.d.size; uVar7 = uVar7 + 1) {
    setThreadData_helper
              ((QObjectPrivate *)((this->super_QObjectData).children.d.ptr[uVar7]->d_ptr).d,
               currentData,targetData,status);
  }
  return;
}

Assistant:

void QObjectPrivate::setThreadData_helper(QThreadData *currentData, QThreadData *targetData, QBindingStatus *status)
{
    Q_Q(QObject);

    if (status) {
        // the new thread is already running
        this->bindingStorage.bindingStatus = status;
    }

    // move posted events
    qsizetype eventsMoved = 0;
    for (qsizetype i = 0; i < currentData->postEventList.size(); ++i) {
        const QPostEvent &pe = currentData->postEventList.at(i);
        if (!pe.event)
            continue;
        if (pe.receiver == q) {
            // move this post event to the targetList
            targetData->postEventList.addEvent(pe);
            const_cast<QPostEvent &>(pe).event = nullptr;
            ++eventsMoved;
        }
    }
    if (eventsMoved > 0 && targetData->hasEventDispatcher()) {
        targetData->canWait = false;
        targetData->eventDispatcher.loadRelaxed()->wakeUp();
    }

    // the current emitting thread shouldn't restore currentSender after calling moveToThread()
    ConnectionData *cd = connections.loadAcquire();
    if (cd) {
        if (cd->currentSender) {
            cd->currentSender->receiverDeleted();
            cd->currentSender = nullptr;
        }

        // adjust the receiverThreadId values in the Connections
        if (cd) {
            auto *c = cd->senders;
            while (c) {
                QObject *r = c->receiver.loadRelaxed();
                if (r) {
                    Q_ASSERT(r == q);
                    targetData->ref();
                    QThreadData *old = c->receiverThreadData.loadRelaxed();
                    if (old)
                        old->deref();
                    c->receiverThreadData.storeRelaxed(targetData);
                }
                c = c->next;
            }
        }

    }

    // set new thread data
    targetData->ref();
    threadData.loadRelaxed()->deref();

    // synchronizes with loadAcquire e.g. in QCoreApplication::postEvent
    threadData.storeRelease(targetData);

    for (int i = 0; i < children.size(); ++i) {
        QObject *child = children.at(i);
        child->d_func()->setThreadData_helper(currentData, targetData, status);
    }
}